

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench_impl.h
# Opt level: O3

void run_ecdh_bench(int iters,int argc,char **argv)

{
  int iVar1;
  undefined8 uVar2;
  long lVar3;
  int in_R9D;
  bench_ecdh_data data;
  undefined8 uVar4;
  
  uVar2 = secp256k1_context_create(1);
  uVar4 = uVar2;
  if (argc != 1) {
    lVar3 = 8;
    do {
      if ((long)argc * 8 == lVar3) goto LAB_00103938;
      iVar1 = strcmp(*(char **)((long)argv + lVar3),"ecdh");
      lVar3 = lVar3 + 8;
    } while (iVar1 != 0);
  }
  uVar2 = uVar4;
  run_benchmark("ecdh",bench_ecdh,bench_ecdh_setup,
                (_func_void_void_ptr_int *)&stack0xffffffffffffff68,(void *)(ulong)(uint)iters,
                in_R9D,(int)uVar2);
LAB_00103938:
  secp256k1_context_destroy(uVar2);
  return;
}

Assistant:

static void run_ecdh_bench(int iters, int argc, char** argv) {
    bench_ecdh_data data;
    int d = argc == 1;

    /* create a context with no capabilities */
    data.ctx = secp256k1_context_create(SECP256K1_FLAGS_TYPE_CONTEXT);

    if (d || have_flag(argc, argv, "ecdh")) run_benchmark("ecdh", bench_ecdh, bench_ecdh_setup, NULL, &data, 10, iters);

    secp256k1_context_destroy(data.ctx);
}